

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TLaplaceExample1::graduxy<Fad<double>>
          (TLaplaceExample1 *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *grad)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  TPZVec<Fad<double>_> *pTVar5;
  Fad<Fad<double>_> *pFVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Fad<Fad<double>_> temp;
  TPZManVector<Fad<Fad<double>_>,_3> xfad;
  undefined8 uStack_2c0;
  undefined4 auStack_2b8 [2];
  undefined8 auStack_2b0 [2];
  undefined8 uStack_2a0;
  TLaplaceExample1 *apTStack_298 [2];
  TPZVec<Fad<double>_> *local_288;
  undefined1 local_280 [24];
  double *local_268;
  double local_260;
  Vector<Fad<double>_> local_258;
  Fad<double> local_248 [7];
  TPZManVector<Fad<Fad<double>_>,_3> local_158;
  
  uStack_2a0 = 0x13c7239;
  apTStack_298[1] = this;
  local_288 = grad;
  TPZManVector<Fad<Fad<double>_>,_3>::TPZManVector(&local_158,x->fNElements);
  lVar9 = 0x50;
  lVar7 = 0;
  lVar8 = 0;
  do {
    uStack_2a0 = 0x13c7263;
    Fad<Fad<double>_>::Fad
              ((Fad<Fad<double>_> *)local_280,3,(int)lVar8,
               (Fad<double> *)((long)&x->fStore->val_ + lVar7));
    pFVar6 = local_158.super_TPZVec<Fad<Fad<double>_>_>.fStore;
    *(undefined8 *)((long)local_158.super_TPZVec<Fad<Fad<double>_>_>.fStore + lVar9 + -0x48) =
         local_280._8_8_;
    uStack_2a0 = 0x13c7288;
    Vector<double>::operator=
              ((Vector<double> *)
               ((long)local_158.super_TPZVec<Fad<Fad<double>_>_>.fStore + lVar9 + -0x40),
               (Vector<double> *)(local_280 + 0x10));
    *(double *)((long)pFVar6 + lVar9 + -0x30) = local_260;
    uStack_2a0 = 0x13c72a3;
    Vector<Fad<double>_>::operator=
              ((Vector<Fad<double>_> *)((long)pFVar6 + lVar9 + -0x28),&local_258);
    *(double *)((long)pFVar6 + lVar9 + -0x18) = local_248[0].val_;
    uStack_2a0 = 0x13c72c0;
    Vector<double>::operator=((Vector<double> *)((long)pFVar6 + lVar9 + -0x10),&local_248[0].dx_);
    *(double *)(&pFVar6->field_0x0 + lVar9) = local_248[0].defaultVal;
    uStack_2a0 = 0x13c72d6;
    Fad<double>::~Fad(local_248);
    uStack_2a0 = 0x13c72de;
    Vector<Fad<double>_>::~Vector(&local_258);
    uStack_2a0 = 0x13c72e8;
    Fad<double>::~Fad((Fad<double> *)(local_280 + 8));
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x20;
    lVar9 = lVar9 + 0x58;
  } while (lVar8 != 3);
  local_280._0_8_ = &PTR__TPZManVector_019e1100;
  lVar7 = 0x68;
  do {
    *(undefined8 *)((long)&uStack_2c0 + lVar7) = 0;
    *(undefined4 *)((long)auStack_2b8 + lVar7) = 0;
    *(undefined8 *)(local_280 + lVar7) = 0;
    *(undefined8 *)(local_280 + lVar7 + 8) = 0;
    *(undefined8 *)((long)auStack_2b0 + lVar7) = 0;
    *(undefined8 *)((long)auStack_2b0 + lVar7 + 8) = 0;
    *(undefined4 *)((long)apTStack_298 + lVar7 + -8) = 0;
    *(undefined8 *)((long)apTStack_298 + lVar7) = 0;
    *(undefined8 *)((long)apTStack_298 + lVar7 + 8) = 0;
    *(undefined4 *)((long)&local_288 + lVar7) = 0;
    lVar7 = lVar7 + 0x58;
  } while (lVar7 != 0x170);
  local_280._8_8_ = &local_260;
  local_280._16_8_ = 1;
  local_268 = (double *)0x0;
  uStack_2a0 = 0x13c7376;
  uxy<Fad<Fad<double>>>
            (apTStack_298[1],&local_158.super_TPZVec<Fad<Fad<double>_>_>,
             (TPZVec<Fad<Fad<double>_>_> *)local_280);
  pTVar5 = local_288;
  uStack_2a0 = 0x13c738a;
  (*local_288->_vptr_TPZVec[4])(local_288,3);
  lVar7 = 0;
  do {
    pFVar3 = ((Vector<Fad<double>_> *)(local_280._8_8_ + 0x28))->ptr_to_data;
    pFVar4 = pTVar5->fStore;
    puVar1 = (undefined8 *)((long)&pFVar3->val_ + lVar7);
    puVar2 = (undefined8 *)((long)&pFVar4->val_ + lVar7);
    *puVar2 = *puVar1;
    uStack_2a0 = 0x13c73b9;
    Vector<double>::operator=((Vector<double> *)(puVar2 + 1),(Vector<double> *)(puVar1 + 1));
    *(undefined8 *)((long)&pFVar4->defaultVal + lVar7) =
         *(undefined8 *)((long)&pFVar3->defaultVal + lVar7);
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x60);
  uStack_2a0 = 0x13c73db;
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector((TPZManVector<Fad<Fad<double>_>,_3> *)local_280)
  ;
  uStack_2a0 = 0x13c73e8;
  TPZManVector<Fad<Fad<double>_>,_3>::~TPZManVector(&local_158);
  return;
}

Assistant:

void TLaplaceExample1::graduxy<Fad<STATE>>(const TPZVec<Fad<STATE>> &x, TPZVec<Fad<STATE>> &grad) const
{
    typedef Fad<STATE> TVar;
    TPZManVector<Fad<TVar>,3> xfad(x.size());
    for(int i=0; i<3; i++)
    {
        Fad<TVar> temp = Fad<TVar>(3,i,x[i]);
        xfad[i] = temp;
    }
    TPZManVector<Fad<TVar>,3> result(1);
    uxy(xfad,result);
    grad.resize(3);
    for (int i=0; i<3; i++)
    {
            grad[i] = result[0].d(i);
    }
}